

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O1

void __thiscall QOpenGLWindow::resizeEvent(QOpenGLWindow *this,QResizeEvent *event)

{
  int iVar1;
  int extraout_var;
  int extraout_EDX;
  int extraout_var_00;
  
  QOpenGLWindowPrivate::initialize(*(QOpenGLWindowPrivate **)&this->field_0x8);
  iVar1 = QWindow::geometry();
  QWindow::geometry();
  (**(code **)(*(long *)this + 0x140))
            (this,(extraout_EDX - iVar1) + 1,(extraout_var_00 - extraout_var) + 1);
  return;
}

Assistant:

void QOpenGLWindow::resizeEvent(QResizeEvent *event)
{
    Q_UNUSED(event);
    Q_D(QOpenGLWindow);
    d->initialize();
    resizeGL(width(), height());
}